

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O1

int __thiscall QtMWidgets::MessageBoxPrivate::init(MessageBoxPrivate *this,EVP_PKEY_CTX *ctx)

{
  MessageBox *pMVar1;
  ColorGroup CVar2;
  int iVar3;
  QVBoxLayout *pQVar4;
  QFrame *pQVar5;
  MsgBoxTitle *this_00;
  ScrollArea *this_01;
  TextLabel *pTVar6;
  long *plVar7;
  QHBoxLayout *this_02;
  MsgBoxButton *this_03;
  QString *in_RDX;
  QString local_48;
  ButtonRole local_2c;
  
  QDialog::setModal(SUB81(this->q,0));
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4,(QWidget *)this->q);
  QLayout::setContentsMargins((int)pQVar4,0,0,0);
  pQVar5 = (QFrame *)operator_new(0x28);
  QFrame::QFrame(pQVar5,this->q,0);
  this->frame = pQVar5;
  QFrame::setFrameStyle((int)pQVar5);
  QBoxLayout::addWidget(pQVar4,this->frame,0,0);
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4,(QWidget *)this->frame);
  this->vbox = pQVar4;
  (**(code **)(*(long *)pQVar4 + 0x68))(pQVar4,0);
  QLayout::setContentsMargins((int)this->vbox,3,3,3);
  this_00 = (MsgBoxTitle *)operator_new(0x30);
  MsgBoxTitle::MsgBoxTitle(this_00,(QString *)ctx,(QWidget *)this->frame);
  this->title = this_00;
  QBoxLayout::addWidget(this->vbox,this_00,0);
  pQVar5 = (QFrame *)operator_new(0x28);
  QFrame::QFrame(pQVar5,this->frame,0);
  this->h1 = pQVar5;
  QFrame::setFrameStyle((int)pQVar5);
  QBoxLayout::addWidget(this->vbox,this->h1,0);
  this_01 = (ScrollArea *)operator_new(0x30);
  ScrollArea::ScrollArea(this_01,(QWidget *)this->frame);
  this->scrollArea = this_01;
  ScrollArea::setWidgetResizable(this_01,true);
  pTVar6 = (TextLabel *)operator_new(0x30);
  TextLabel::TextLabel(pTVar6,(QWidget *)this->frame,(WindowFlags)0x0);
  this->textLabel = pTVar6;
  QWidget::setBackgroundRole((ColorRole)pTVar6);
  pTVar6 = this->textLabel;
  CVar2 = QWidget::palette();
  plVar7 = (long *)QPalette::brush(CVar2,Dark);
  TextLabel::setColor(pTVar6,(QColor *)(*plVar7 + 8));
  QWidget::setAutoFillBackground(SUB81(this->textLabel,0));
  TextLabel::setText(this->textLabel,in_RDX);
  ScrollArea::setWidget(this->scrollArea,(QWidget *)this->textLabel);
  QBoxLayout::addWidget(this->vbox,this->scrollArea,0);
  pQVar5 = (QFrame *)operator_new(0x28);
  QFrame::QFrame(pQVar5,this->frame,0);
  this->h2 = pQVar5;
  QFrame::setFrameStyle((int)pQVar5);
  QBoxLayout::addWidget(this->vbox,this->h2,0);
  this_02 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_02);
  this->hbox = this_02;
  (**(code **)(*(long *)this_02 + 0x68))(this_02);
  QLayout::setContentsMargins((int)this->hbox,0,0,0);
  this_03 = (MsgBoxButton *)operator_new(0x30);
  QMetaObject::tr((char *)&local_48,(char *)&QObject::staticMetaObject,0x17c730);
  MsgBoxButton::MsgBoxButton(this_03,&local_48,(QWidget *)this->frame);
  this->okButton = this_03;
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  local_48.d.d = (Data *)this->okButton;
  local_2c = AcceptRole;
  QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::detach(&this->buttonsMap);
  std::
  map<QAbstractButton*,QtMWidgets::MessageBox::ButtonRole,std::less<QAbstractButton*>,std::allocator<std::pair<QAbstractButton*const,QtMWidgets::MessageBox::ButtonRole>>>
  ::insert_or_assign<QtMWidgets::MessageBox::ButtonRole_const&>
            ((map<QAbstractButton*,QtMWidgets::MessageBox::ButtonRole,std::less<QAbstractButton*>,std::allocator<std::pair<QAbstractButton*const,QtMWidgets::MessageBox::ButtonRole>>>
              *)&((this->buttonsMap).d.d)->m,(key_type *)&local_48,&local_2c);
  local_48.d.d = (Data *)this->okButton;
  QtPrivate::QPodArrayOps<QAbstractButton*>::emplace<QAbstractButton*&>
            ((QPodArrayOps<QAbstractButton*> *)&this->buttons,(this->buttons).d.size,
             (QAbstractButton **)&local_48);
  QBoxLayout::addWidget(this->hbox,this->okButton,0,0);
  QBoxLayout::addLayout((QLayout *)this->vbox,(int)this->hbox);
  pMVar1 = this->q;
  local_48.d.d = (Data *)(**(code **)(*(long *)this->vbox + 0xf0))();
  iVar3 = QWidget::resize((QSize *)pMVar1);
  return iVar3;
}

Assistant:

void
MessageBoxPrivate::init( const QString & titl, const QString & txt )
{
	q->setModal( true );

	QVBoxLayout * layout = new QVBoxLayout( q );
	layout->setContentsMargins( 0, 0, 0, 0 );

	frame = new QFrame( q );
	frame->setFrameStyle( QFrame::Box | QFrame::Plain );
	layout->addWidget( frame );

	vbox = new QVBoxLayout( frame );
	vbox->setSpacing( 0 );
	vbox->setContentsMargins( 3, 3, 3, 3 );

	title = new MsgBoxTitle( titl, frame );
	vbox->addWidget( title );

	h1 = new QFrame( frame );
	h1->setFrameStyle( QFrame::HLine | QFrame::Sunken );
	vbox->addWidget( h1 );

	scrollArea = new ScrollArea( frame );
	scrollArea->setWidgetResizable( true );

	textLabel = new TextLabel( frame );
	textLabel->setBackgroundRole( QPalette::Window );
    textLabel->setColor( q->palette().color( QPalette::WindowText ) );
	textLabel->setAutoFillBackground( true );
	textLabel->setText( txt );
	scrollArea->setWidget( textLabel );

	vbox->addWidget( scrollArea );

	h2 = new QFrame( frame );
	h2->setFrameStyle( QFrame::HLine | QFrame::Sunken );
	vbox->addWidget( h2 );

	hbox = new QHBoxLayout;
	hbox->setSpacing( 0 );
	hbox->setContentsMargins( 0, 0, 0, 0 );

	okButton = new MsgBoxButton( QObject::tr( "OK" ), frame );
	buttonsMap.insert( okButton, MessageBox::AcceptRole );
	buttons.append( okButton );
	hbox->addWidget( okButton );

	vbox->addLayout( hbox );

	q->resize( vbox->sizeHint() );
}